

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O0

int __thiscall SharedMemory::init(SharedMemory *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int __key;
  undefined1 local_98 [4];
  int ret;
  shmid_ds ds;
  CreateMode mode_local;
  int size_local;
  key_t key_local;
  SharedMemory *this_local;
  
  __key = (int)ctx;
  if (__key == -1) {
    this_local._7_1_ = 0;
  }
  else {
    iVar1 = 0x600;
    if (in_ECX == 0) {
      iVar1 = 0;
    }
    ds.__glibc_reserved6._4_4_ = in_ECX;
    iVar1 = shmget(__key,(long)in_EDX,iVar1);
    this->mShm = iVar1;
    if ((this->mShm == -1) && (ds.__glibc_reserved6._4_4_ == 2)) {
      iVar1 = shmget(__key,(long)in_EDX,0);
      this->mShm = iVar1;
      if (this->mShm != -1) {
        shmctl(this->mShm,0,(shmid_ds *)0x0);
        iVar1 = shmget(__key,(long)in_EDX,0x600);
        this->mShm = iVar1;
      }
    }
    if (this->mShm == -1) {
      this_local._7_1_ = 0;
    }
    else {
      if (ds.__glibc_reserved6._4_4_ != 0) {
        memset(local_98,0,0x70);
        ret = getuid();
        ds.shm_perm.cuid = 0x380;
        iVar1 = shmctl(this->mShm,1,(shmid_ds *)local_98);
        if (iVar1 == -1) {
          shmctl(this->mShm,0,(shmid_ds *)0x0);
          this->mShm = -1;
          this_local._7_1_ = 0;
          goto LAB_00282b8c;
        }
      }
      this->mKey = __key;
      this->mOwner = ds.__glibc_reserved6._4_4_ != 0;
      this->mSize = in_EDX;
      this_local._7_1_ = 1;
    }
  }
LAB_00282b8c:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool SharedMemory::init(key_t key, int size, CreateMode mode)
{
    if (key == -1)
        return false;

    mShm = shmget(key, size, (mode == None ? 0 : (IPC_CREAT | IPC_EXCL)));
    if (mShm == -1 && mode == Recreate) {
        mShm = shmget(key, size, 0);
        if (mShm != -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = shmget(key, size, IPC_CREAT | IPC_EXCL);
        }
    }
    if (mShm == -1)
        return false;

    if (mode != None) {
        shmid_ds ds;
        memset(&ds, 0, sizeof(ds));
        ds.shm_perm.uid = getuid();
        ds.shm_perm.mode = 0600;
#ifdef HAVE_SHMDEST
        ds.shm_perm.mode |= SHM_DEST;
#endif
        const int ret = shmctl(mShm, IPC_SET, &ds);
        if (ret == -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = -1;
            return false;
        }
    }
    mKey = key;
    mOwner = (mode != None);
    mSize = size;

    return true;
}